

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZOneShapeRestraint.h
# Opt level: O0

void __thiscall TPZOneShapeRestraint::TPZOneShapeRestraint(TPZOneShapeRestraint *this)

{
  pair<long,_int> *this_00;
  TPZVec<std::pair<long,_int>_> *in_RDI;
  pair<long,_int> pVar1;
  int i;
  int *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int *copy;
  TPZManVector<int,_4> *in_stack_ffffffffffffffb0;
  long local_30;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe4;
  
  copy = (int *)0x4;
  TPZManVector<std::pair<long,_int>,_4>::TPZManVector
            ((TPZManVector<std::pair<long,_int>,_4> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  TPZManVector<int,_4>::TPZManVector(in_stack_ffffffffffffffb0,(int64_t)(in_RDI + 3),copy);
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    pVar1 = std::make_pair<long,int>
                      ((long *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78);
    local_30 = pVar1.first;
    in_stack_ffffffffffffff84 = pVar1.second;
    this_00 = TPZVec<std::pair<long,_int>_>::operator[](in_RDI,(long)iVar2);
    std::pair<long,_int>::operator=(this_00,(type)&local_30);
  }
  return;
}

Assistant:

TPZOneShapeRestraint() : fFaces(4), fOrient(4,-1)
    {
        for(int i=0; i<4; i++)
        {
            fFaces[i] = std::make_pair<int64_t,int>(-1, -1);
        }
    }